

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CMethod *statement)

{
  CCompoundStm *pCVar1;
  ISubtreeWrapper *pIVar2;
  IExpression *pIVar3;
  ISubtreeWrapper *pIVar4;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  *this_00;
  string *psVar5;
  string *methodName;
  ISubtreeWrapper *pIVar6;
  CLabelStatement *this_01;
  CSeqStatement *this_02;
  CMoveStatement *pCVar7;
  CMemExpression *this_03;
  IAddress *pIVar8;
  CSeqStatement *pCVar9;
  tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_> this_04;
  CBuildVisitor *this_05;
  _Alloc_hider _Var10;
  string methodFullName;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_158;
  CExpression *local_150;
  __uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_148;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_140;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_138 [2];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_100;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_f8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_f0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_e8;
  CLabelStatement *local_e0;
  CSeqStatement *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  CLabel local_70;
  CLabel local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CMethodStm\n",0x18);
  std::__cxx11::string::_M_assign((string *)&this->currentMethod);
  this_05 = (CBuildVisitor *)statement;
  buildNewFrame(this,statement);
  psVar5 = IRT::CFrame::GetClassName_abi_cxx11_(this->currentFrame);
  methodName = IRT::CFrame::GetMethodName_abi_cxx11_(this->currentFrame);
  GetMethodFullName(&local_90,this_05,psVar5,methodName);
  pCVar1 = (statement->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IStatement).super_PositionedNode)(pCVar1,this);
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar3 = (statement->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_158);
  local_150 = (CExpression *)local_158._M_head_impl;
  if (pIVar2 == (ISubtreeWrapper *)0x0) {
    pIVar6 = (ISubtreeWrapper *)operator_new(0x10);
    pCVar9 = (CSeqStatement *)operator_new(0x18);
    this_04.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         operator_new(0x28);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    IRT::CLabel::CLabel(&local_70,&local_d0);
    IRT::CLabelStatement::CLabelStatement
              ((CLabelStatement *)
               this_04.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl,&local_70);
    local_148._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         this_04.
         super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
         .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    pCVar7 = (CMoveStatement *)operator_new(0x18);
    pIVar8 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar8->_vptr_IAddress[2])(&local_158,pIVar8);
    local_120._M_head_impl = (CExpression *)local_158._M_head_impl;
    local_158._M_head_impl = (CStatement *)0x0;
    local_128._M_head_impl = local_150;
    IRT::CMoveStatement::CMoveStatement
              (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_120,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_128);
    local_118._M_head_impl = (CStatement *)pCVar7;
    IRT::CSeqStatement::CSeqStatement
              (pCVar9,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_148,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_118);
    pIVar6->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001814e8;
    pIVar6[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar9;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar6;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if ((CMoveStatement *)local_118._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_118._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_118._M_head_impl = (CStatement *)0x0;
    if (local_128._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_128._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_128._M_head_impl = (CExpression *)0x0;
    if (local_120._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_120._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_120._M_head_impl = (CExpression *)0x0;
    if (local_158._M_head_impl != (CStatement *)0x0) {
      (*((local_158._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if (local_148._M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)0x0)
    {
      (**(code **)(*(long *)local_148._M_t.
                            super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                            .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl +
                  0x10))();
    }
    local_148._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (tuple<const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
         (_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)0x0
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.label._M_dataplus._M_p != &local_70.label.field_2) {
      operator_delete(local_70.label._M_dataplus._M_p);
    }
    psVar5 = &local_d0;
    _Var10._M_p = local_d0._M_dataplus._M_p;
  }
  else {
    pIVar6 = (ISubtreeWrapper *)operator_new(0x10);
    local_d8 = (CSeqStatement *)operator_new(0x18);
    this_01 = (CLabelStatement *)operator_new(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_e0 = this_01;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    IRT::CLabel::CLabel(&local_50,&local_b0);
    IRT::CLabelStatement::CLabelStatement(this_01,&local_50);
    local_138[0]._M_head_impl = (CStatement *)this_01;
    this_02 = (CSeqStatement *)operator_new(0x18);
    (*pIVar2->_vptr_ISubtreeWrapper[1])(&local_158,pIVar2);
    local_140._M_head_impl = local_158._M_head_impl;
    local_158._M_head_impl = (CStatement *)0x0;
    pCVar7 = (CMoveStatement *)operator_new(0x18);
    this_03 = (CMemExpression *)operator_new(0x10);
    pIVar8 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar8->_vptr_IAddress[2])(&local_108,pIVar8);
    local_100._M_head_impl = local_108._M_head_impl;
    local_108._M_head_impl = (CExpression *)0x0;
    IRT::CMemExpression::CMemExpression
              (this_03,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_100);
    local_110._M_head_impl = local_150;
    local_f8._M_head_impl = (CExpression *)this_03;
    IRT::CMoveStatement::CMoveStatement
              (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_f8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_110);
    local_f0._M_head_impl = (CStatement *)pCVar7;
    IRT::CSeqStatement::CSeqStatement
              (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_140,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_f0);
    pCVar9 = local_d8;
    local_e8._M_head_impl = (CStatement *)this_02;
    IRT::CSeqStatement::CSeqStatement
              (local_d8,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)local_138,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_e8);
    pIVar6->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001814e8;
    pIVar6[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar9;
    pIVar4 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar6;
    if (pIVar4 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar4);
    }
    if ((CSeqStatement *)local_e8._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_e8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_e8._M_head_impl = (CStatement *)0x0;
    if ((CMoveStatement *)local_f0._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_f0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_f0._M_head_impl = (CStatement *)0x0;
    if (local_110._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_110._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_110._M_head_impl = (CExpression *)0x0;
    if ((CMemExpression *)local_f8._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_f8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_f8._M_head_impl = (CExpression *)0x0;
    if (local_100._M_head_impl != (CExpression *)0x0) {
      (*((local_100._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_100._M_head_impl = (CExpression *)0x0;
    if (local_108._M_head_impl != (CExpression *)0x0) {
      (*((local_108._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_140._M_head_impl != (CStatement *)0x0) {
      (*((local_140._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_140._M_head_impl = (CStatement *)0x0;
    if (local_158._M_head_impl != (CStatement *)0x0) {
      (*((local_158._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_138[0]._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_138[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_138[0]._M_head_impl = (CStatement *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.label._M_dataplus._M_p != &local_50.label.field_2) {
      operator_delete(local_50.label._M_dataplus._M_p);
    }
    psVar5 = &local_b0;
    _Var10._M_p = local_b0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &psVar5->field_2) {
    operator_delete(_Var10._M_p);
  }
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
             *)(this->treesOfMethods).
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  (*((this->wrapper)._M_t.
     super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
     super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
     super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper[1])
            (&local_158);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string&,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            (this_00,&local_90,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_158);
  if (local_158._M_head_impl != (CStatement *)0x0) {
    (*((local_158._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  if (pIVar2 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CMethod &statement ) {

    std::cout << "IRT builder: CMethodStm\n";
    currentMethod = statement.name->name;
    buildNewFrame( &statement );
    std::string methodFullName = GetMethodFullName( currentFrame->GetClassName( ), currentFrame->GetMethodName( ));

    statement.statements->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> statementListWrapper = std::move( wrapper );

    statement.returnExp->Accept( *this );
    std::unique_ptr<const IRT::CExpression> expressionReturn = std::move( wrapper->ToExpression( ));

    if ( statementListWrapper ) {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                                std::move( statementListWrapper->ToStatement( )),
                                std::move( std::unique_ptr<const IRT::CStatement>(
                                        new IRT::CMoveStatement(
                                                std::move( std::unique_ptr<IRT::CExpression>( new IRT::CMemExpression(
                                                        std::move(
                                                                currentFrame->GetReturnValueAddress( )->ToExpression( ))))),
                                                std::move( expressionReturn )
                                        )
                                ))
                        )))
                )))
        ));
    } else {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CMoveStatement(
                                std::move( currentFrame->GetReturnValueAddress( )->ToExpression( )),
                                std::move( expressionReturn )
                        )))
                )))
        ));
    }

    treesOfMethods->emplace( methodFullName, std::move( wrapper->ToStatement( )));
}